

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QRect *r)

{
  int iVar1;
  int iVar2;
  QTextStream *pQVar3;
  storage_type *in_RCX;
  int *in_RDX;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)r);
  pQVar3 = *(QTextStream **)r;
  *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QRect";
  QString::fromUtf8(&local_48,(QString *)0x5,ba);
  QTextStream::operator<<(pQVar3,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,'(');
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,*in_RDX);
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,',');
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,in_RDX[1]);
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,' ');
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  lVar4 = (long)in_RDX[2] - (long)*in_RDX;
  iVar1 = in_RDX[3];
  iVar2 = in_RDX[1];
  QTextStream::operator<<(*(QTextStream **)r,lVar4 + 1);
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,'x');
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  QTextStream::operator<<(*(QTextStream **)r,((long)iVar1 - (long)iVar2) + 1);
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  ba_00.m_data._1_7_ = (undefined7)((ulong)in_RCX >> 8);
  ba_00.m_data._0_1_ = 0x7ffffffe < lVar4;
  if (0x7ffffffe < (long)iVar1 - (long)iVar2 || 0x7ffffffe < lVar4) {
    pQVar3 = *(QTextStream **)r;
    ba_00.m_size = (qsizetype)" (oversized)";
    QString::fromUtf8(&local_48,(QString *)0xc,ba_00);
    QTextStream::operator<<(pQVar3,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)r,' ');
    }
  }
  QTextStream::operator<<(*(QTextStream **)r,')');
  if (*(char *)&(*(QTextStream **)r)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)r,' ');
  }
  r->x1 = 0;
  r->y1 = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = *(_func_int ***)r;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRect &r)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QRect" << '(';
    QtDebugUtils::formatQRect(dbg, r);
    dbg << ')';
    return dbg;
}